

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_api.hpp
# Opt level: O0

void __thiscall hrgls::API::~API(API *this)

{
  API_private *this_00;
  API *this_local;
  
  if ((this->m_private != (API_private *)0x0) && (this->m_private->m_api != (hrgls_API)0x0)) {
    hrgls_APIDestroy(this->m_private->m_api);
  }
  this_00 = this->m_private;
  if (this_00 != (API_private *)0x0) {
    API_private::~API_private(this_00);
    operator_delete(this_00);
  }
  return;
}

Assistant:

API::~API()
  {
    // Destroy any API object we created.
    if (m_private && m_private->m_api) {
      hrgls_APIDestroy(m_private->m_api);
    }
    delete m_private;
  }